

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

predictor * __thiscall
Search::predictor::add_allowed(predictor *this,v_array<std::pair<unsigned_int,_float>_> *a)

{
  pair<unsigned_int,_float> *ppVar1;
  ulong uVar2;
  
  ppVar1 = a->_begin;
  if (a->_end != ppVar1) {
    uVar2 = 0;
    do {
      add_to<unsigned_int>
                (this,&this->allowed_actions,&this->allowed_is_pointer,ppVar1[uVar2].first,false);
      add_to<float>(this,&this->allowed_actions_cost,&this->allowed_cost_is_pointer,
                    a->_begin[uVar2].second,false);
      uVar2 = uVar2 + 1;
      ppVar1 = a->_begin;
    } while (uVar2 < (ulong)((long)a->_end - (long)ppVar1 >> 3));
  }
  return this;
}

Assistant:

predictor& predictor::add_allowed(v_array<pair<action, float>>& a)
{
  for (size_t i = 0; i < a.size(); i++)
  {
    add_to(allowed_actions, allowed_is_pointer, a[i].first, false);
    add_to(allowed_actions_cost, allowed_cost_is_pointer, a[i].second, false);
  }
  return *this;
}